

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

ActionResultHolder<unsigned_char> *
testing::internal::
DownCast_<testing::internal::ActionResultHolder<unsigned_char>*,testing::internal::UntypedActionResultHolderBase>
          (UntypedActionResultHolderBase *f)

{
  bool bVar1;
  ostream *poVar2;
  long local_38;
  bool local_25;
  GTestLog local_14;
  ActionResultHolder<unsigned_char> *local_10;
  UntypedActionResultHolderBase *f_local;
  
  local_25 = true;
  local_10 = (ActionResultHolder<unsigned_char> *)f;
  if (f != (UntypedActionResultHolderBase *)0x0) {
    if (f == (UntypedActionResultHolderBase *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = __dynamic_cast(f,&UntypedActionResultHolderBase::typeinfo,
                                &ActionResultHolder<unsigned_char>::typeinfo,0);
    }
    local_25 = local_38 != 0;
  }
  bVar1 = IsTrue(local_25);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O0/_deps/googletest-src/googletest/include/gtest/internal/gtest-port.h"
                       ,0x5ea);
    poVar2 = GTestLog::GetStream(&local_14);
    std::operator<<(poVar2,"Condition f == NULL || dynamic_cast<To>(f) != NULL failed. ");
    GTestLog::~GTestLog(&local_14);
  }
  return local_10;
}

Assistant:

inline To DownCast_(From* f) {  // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (false) {
  GTEST_INTENTIONAL_CONST_COND_POP_()
    const To to = NULL;
    ::testing::internal::ImplicitCast_<From*>(to);
  }

#if GTEST_HAS_RTTI
  // RTTI: debug mode only!
  GTEST_CHECK_(f == NULL || dynamic_cast<To>(f) != NULL);
#endif
  return static_cast<To>(f);
}